

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFFPdu.cpp
# Opt level: O0

int __thiscall DIS::IFFPdu::getMarshalledSize(IFFPdu *this)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  size_type sVar11;
  const_reference pvVar12;
  undefined1 local_40 [8];
  IFFFundamentalParameterData listElement;
  unsigned_long_long idx;
  int marshalSize;
  IFFPdu *this_local;
  
  iVar2 = DistributedEmissionsFamilyPdu::getMarshalledSize
                    (&this->super_DistributedEmissionsFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_emittingEntityID);
  iVar4 = EventIdentifier::getMarshalledSize(&this->_eventID);
  iVar5 = Vector3Float::getMarshalledSize(&this->_relativeAntennaLocation);
  iVar6 = SystemIdentifier::getMarshalledSize(&this->_systemID);
  iVar7 = FundamentalOperationalData::getMarshalledSize(&this->_fundamentalOperationalData);
  iVar8 = LayerHeader::getMarshalledSize(&this->_layerHeader);
  iVar9 = BeamData::getMarshalledSize(&this->_beamData);
  iVar10 = SecondaryOperationalData::getMarshalledSize(&this->_secondaryOperationalData);
  idx._4_4_ = iVar2 + iVar3 + iVar4 + iVar5 + iVar6 + 3 + iVar7 + iVar8 + iVar9 + iVar10;
  listElement._burstLength = 0;
  listElement._applicableModes = '\0';
  listElement._systemSpecificData[0] = '\0';
  listElement._systemSpecificData[1] = '\0';
  listElement._systemSpecificData[2] = '\0';
  while( true ) {
    uVar1 = listElement._24_8_;
    sVar11 = std::
             vector<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
             ::size(&this->_iffParameters);
    if (sVar11 <= (ulong)uVar1) break;
    pvVar12 = std::
              vector<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
              ::operator[](&this->_iffParameters,listElement._24_8_);
    IFFFundamentalParameterData::IFFFundamentalParameterData
              ((IFFFundamentalParameterData *)local_40,pvVar12);
    iVar2 = IFFFundamentalParameterData::getMarshalledSize((IFFFundamentalParameterData *)local_40);
    idx._4_4_ = idx._4_4_ + iVar2;
    IFFFundamentalParameterData::~IFFFundamentalParameterData
              ((IFFFundamentalParameterData *)local_40);
    listElement._24_8_ = listElement._24_8_ + 1;
  }
  return idx._4_4_;
}

Assistant:

int IFFPdu::getMarshalledSize() const
{
    int marshalSize = 0;

    marshalSize = DistributedEmissionsFamilyPdu::getMarshalledSize();
    marshalSize = marshalSize + _emittingEntityID.getMarshalledSize();  // _emittingEntityID
    marshalSize = marshalSize + _eventID.getMarshalledSize();  // _eventID
    marshalSize = marshalSize + _relativeAntennaLocation.getMarshalledSize(); //_relativeAntennaLocation
    marshalSize = marshalSize + 1;  // _numberOfIFFParameters
    marshalSize = marshalSize + _systemID.getMarshalledSize(); //_systemID
    marshalSize = marshalSize + 1; //_systemDesignator
    marshalSize = marshalSize + 1; //_systemSpecificData
    marshalSize = marshalSize + _fundamentalOperationalData.getMarshalledSize();  // _fundamentalOperationalData
    marshalSize = marshalSize + _layerHeader.getMarshalledSize();  // _layerHeader
    marshalSize = marshalSize + _beamData.getMarshalledSize();  // _beamData
    marshalSize = marshalSize + _secondaryOperationalData.getMarshalledSize();  // _secondaryOperationalData

    for(unsigned long long idx=0; idx < _iffParameters.size(); idx++)
    {
        IFFFundamentalParameterData listElement = _iffParameters[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}